

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_stbvorbis_uninit(ma_stbvorbis *pVorbis,ma_allocation_callbacks *pAllocationCallbacks)

{
  if (pVorbis != (ma_stbvorbis *)0x0) {
    stb_vorbis_close(pVorbis->stb);
    if (pVorbis->usingPushMode != 0) {
      ma_free((pVorbis->push).pData,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_stbvorbis_uninit(ma_stbvorbis* pVorbis, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pVorbis == NULL) {
        return;
    }

    #if !defined(MA_NO_VORBIS)
    {
        stb_vorbis_close(pVorbis->stb);

        /* We'll have to clear some memory if we're using push mode. */
        if (pVorbis->usingPushMode) {
            ma_free(pVorbis->push.pData, pAllocationCallbacks);
        }
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
    }
    #endif

    ma_data_source_uninit(&pVorbis->ds);
}